

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O1

void __thiscall
cmDocumentationFormatter::PrintColumn(cmDocumentationFormatter *this,ostream *os,string *text)

{
  byte *pbVar1;
  long lVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  bool bVar7;
  long *local_70;
  long local_68;
  long local_60 [2];
  cmDocumentationFormatter *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_38 = this->TextWidth;
  local_40 = this->TextIndent;
  local_50 = this;
  if (local_38 <= local_40) {
    __assert_fail("this->TextIndent < this->TextWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDocumentationFormatter.cxx"
                  ,0x7d,
                  "void cmDocumentationFormatter::PrintColumn(std::ostream &, const std::string &) const"
                 );
  }
  pbVar5 = (byte *)(text->_M_dataplus)._M_p;
  pbVar4 = pbVar5;
  if (pbVar5 != (byte *)0x0) {
    while ((0x20 < (ulong)*pbVar4 || ((0x100000401U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))) {
      pbVar4 = pbVar4 + 1;
    }
    if (*pbVar5 != 0) {
      uVar3 = CONCAT71((int7)((ulong)this >> 8),1);
      bVar7 = false;
      lVar6 = 0;
      do {
        lVar2 = (long)pbVar4 - (long)pbVar5;
        if (lVar2 < (long)(local_38 - (local_40 + lVar6 + (ulong)bVar7))) {
          if (pbVar5 < pbVar4) {
            local_48 = uVar3;
            if (lVar6 == 0) {
              if (local_50->TextIndent == 0 || (uVar3 & 1) != 0) {
                lVar6 = 0;
              }
              else {
                local_70 = local_60;
                std::__cxx11::string::_M_construct((ulong)&local_70,(char)local_50->TextIndent);
                std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
                if (local_70 != local_60) {
                  operator_delete(local_70,local_60[0] + 1);
                }
                lVar6 = 0;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"RPATH_REMOVE could not remove RPATH from file: \n  " +
                            (ulong)(bVar7 ^ 1) + 0x30,2 - (ulong)(bVar7 ^ 1));
              lVar6 = lVar6 + (ulong)bVar7 + 1;
            }
            std::ostream::write((char *)os,(long)pbVar5);
            bVar7 = pbVar4[-1] == 0x2e;
            uVar3 = local_48;
          }
          if (*pbVar4 == 10) {
            local_70 = (long *)CONCAT71(local_70._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_70,1);
            pbVar4 = pbVar4 + 1;
            uVar3 = 0;
            lVar2 = 0;
          }
          else {
            lVar2 = lVar2 + lVar6;
          }
        }
        else {
          local_70 = (long *)CONCAT71(local_70._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_70,1);
          if (pbVar5 < pbVar4) {
            local_70 = local_60;
            std::__cxx11::string::_M_construct((ulong)&local_70,(char)local_50->TextIndent);
            std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
            if (local_70 != local_60) {
              operator_delete(local_70,local_60[0] + 1);
            }
            std::ostream::write((char *)os,(long)pbVar5);
            bVar7 = pbVar4[-1] == 0x2e;
            uVar3 = 0;
          }
          else {
            uVar3 = 0;
            lVar2 = 0;
          }
        }
        pbVar5 = pbVar4 + -1;
        do {
          pbVar1 = pbVar5 + 1;
          pbVar5 = pbVar5 + 1;
          pbVar4 = pbVar5;
        } while (*pbVar1 == 0x20);
        while ((0x20 < (ulong)*pbVar4 || ((0x100000401U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))) {
          pbVar4 = pbVar4 + 1;
        }
        lVar6 = lVar2;
      } while (*pbVar5 != 0);
    }
    return;
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDocumentationFormatter.cxx"
                ,0x1a,"const char *(anonymous namespace)::skipToSpace(const char *)");
}

Assistant:

void cmDocumentationFormatter::PrintColumn(std::ostream& os,
                                           std::string const& text) const
{
  // Print text arranged in an indented column of fixed width.
  bool newSentence = false;
  bool firstLine = true;

  assert(this->TextIndent < this->TextWidth);
  const std::ptrdiff_t width = this->TextWidth - this->TextIndent;
  std::ptrdiff_t column = 0;

  // Loop until the end of the text.
  for (const char *l = text.c_str(), *r = skipToSpace(text.c_str()); *l;
       l = skipSpaces(r), r = skipToSpace(l)) {
    // Does it fit on this line?
    if (r - l < width - column - std::ptrdiff_t(newSentence)) {
      // Word fits on this line.
      if (r > l) {
        if (column) {
          // Not first word on line.  Separate from the previous word
          // by a space, or two if this is a new sentence.
          os << &("  "[std::size_t(!newSentence)]);
          column += 1u + std::ptrdiff_t(newSentence);
        } else if (!firstLine && this->TextIndent) {
          // First word on line.  Print indentation unless this is the
          // first line.
          os << std::string(this->TextIndent, ' ');
        }

        // Print the word.
        os.write(l, r - l);
        newSentence = (*(r - 1) == '.');
      }

      if (*r == '\n') {
        // Text provided a newline.  Start a new line.
        os << '\n';
        ++r;
        column = 0;
        firstLine = false;
      } else {
        // No provided newline.  Continue this line.
        column += r - l;
      }
    } else {
      // Word does not fit on this line.  Start a new line.
      os << '\n';
      firstLine = false;
      if (r > l) {
        os << std::string(this->TextIndent, ' ');
        os.write(l, r - l);
        column = r - l;
        newSentence = (*(r - 1) == '.');
      } else {
        column = 0;
      }
    }
    // Move to beginning of next word.  Skip over whitespace.
  }
}